

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionFromEuler(float pitch,float yaw,float roll)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Quaternion QVar7;
  
  fVar1 = cosf(pitch * 0.5);
  fVar2 = sinf(pitch * 0.5);
  fVar3 = cosf(yaw * 0.5);
  fVar4 = sinf(yaw * 0.5);
  fVar5 = cosf(roll * 0.5);
  fVar6 = sinf(roll * 0.5);
  QVar7.x = fVar2 * fVar3 * fVar5 - fVar6 * fVar1 * fVar4;
  QVar7.z = fVar1 * fVar3 * fVar6 - fVar5 * fVar2 * fVar4;
  QVar7.w = fVar1 * fVar3 * fVar5 + fVar2 * fVar4 * fVar6;
  QVar7.y = fVar1 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6;
  return QVar7;
}

Assistant:

RMAPI Quaternion QuaternionFromEuler(float pitch, float yaw, float roll)
{
    Quaternion result = { 0 };

    float x0 = cosf(pitch*0.5f);
    float x1 = sinf(pitch*0.5f);
    float y0 = cosf(yaw*0.5f);
    float y1 = sinf(yaw*0.5f);
    float z0 = cosf(roll*0.5f);
    float z1 = sinf(roll*0.5f);

    result.x = x1*y0*z0 - x0*y1*z1;
    result.y = x0*y1*z0 + x1*y0*z1;
    result.z = x0*y0*z1 - x1*y1*z0;
    result.w = x0*y0*z0 + x1*y1*z1;

    return result;
}